

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::PrimitiveTypeName(JavaType type)

{
  uint in_EDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogMessage local_48;
  char *local_8;
  
  switch((LogMessage *)(ulong)in_EDI) {
  case (LogMessage *)0x0:
    local_8 = "int";
    break;
  case (LogMessage *)0x1:
    local_8 = "long";
    break;
  case (LogMessage *)0x2:
    local_8 = "float";
    break;
  case (LogMessage *)0x3:
    local_8 = "double";
    break;
  case (LogMessage *)0x4:
    local_8 = "boolean";
    break;
  case (LogMessage *)0x5:
    local_8 = "java.lang.String";
    break;
  case (LogMessage *)0x6:
    local_8 = "com.google.protobuf.ByteString";
    break;
  case (LogMessage *)0x7:
    local_8 = (char *)0x0;
    break;
  case (LogMessage *)0x8:
    local_8 = (char *)0x0;
    break;
  default:
    this = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)in_EDI,(LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20),
               (char *)this,in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x459f93);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* PrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return "int";
    case JAVATYPE_LONG:
      return "long";
    case JAVATYPE_FLOAT:
      return "float";
    case JAVATYPE_DOUBLE:
      return "double";
    case JAVATYPE_BOOLEAN:
      return "boolean";
    case JAVATYPE_STRING:
      return "java.lang.String";
    case JAVATYPE_BYTES:
      return "com.google.protobuf.ByteString";
    case JAVATYPE_ENUM:
      return NULL;
    case JAVATYPE_MESSAGE:
      return NULL;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}